

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O2

bool __thiscall mjs::completion::in_set(completion *this,label_set *ids)

{
  __normal_iterator<const_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_*,_std::vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>_>
  _Var1;
  bool bVar2;
  
  if (this->type - break_ < 2) {
    if ((this->target)._M_len == 0) {
      bVar2 = true;
    }
    else {
      _Var1 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const*,std::vector<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::allocator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const>>
                        ((ids->
                         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (ids->
                         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,&this->target);
      bVar2 = _Var1._M_current !=
              (ids->
              super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    }
    return bVar2;
  }
  __assert_fail("has_target()",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.h"
                ,0x27,"bool mjs::completion::in_set(const label_set &) const");
}

Assistant:

bool has_target() const { return type == completion_type::break_ || type == completion_type::continue_; }